

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_deriveBlockSplits(ZSTD_CCtx *zc,U32 *partitions,U32 nbSeq)

{
  undefined1 local_38 [8];
  seqStoreSplits splits;
  U32 nbSeq_local;
  U32 *partitions_local;
  ZSTD_CCtx *zc_local;
  
  splits.splitLocations = (U32 *)0x0;
  if (nbSeq < 5) {
    zc_local = (ZSTD_CCtx *)0x0;
  }
  else {
    local_38 = (undefined1  [8])partitions;
    splits.idx._4_4_ = nbSeq;
    ZSTD_deriveBlockSplitsHelper((seqStoreSplits *)local_38,0,(ulong)nbSeq,zc,&zc->seqStore);
    *(U32 *)((long)local_38 + splits.splitLocations * 4) = splits.idx._4_4_;
    zc_local = (ZSTD_CCtx *)splits.splitLocations;
  }
  return (size_t)zc_local;
}

Assistant:

static size_t ZSTD_deriveBlockSplits(ZSTD_CCtx* zc, U32 partitions[], U32 nbSeq) {
    seqStoreSplits splits = {partitions, 0};
    if (nbSeq <= 4) {
        DEBUGLOG(4, "ZSTD_deriveBlockSplits: Too few sequences to split");
        /* Refuse to try and split anything with less than 4 sequences */
        return 0;
    }
    ZSTD_deriveBlockSplitsHelper(&splits, 0, nbSeq, zc, &zc->seqStore);
    splits.splitLocations[splits.idx] = nbSeq;
    DEBUGLOG(5, "ZSTD_deriveBlockSplits: final nb partitions: %zu", splits.idx+1);
    return splits.idx;
}